

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::GPUShaderFP64Test2::getMaxUniformComponents
          (GPUShaderFP64Test2 *this,shaderStage shader_stage)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 local_28;
  GLuint local_24;
  GLenum pname;
  GLint max_uniform_components;
  Functions *gl;
  GPUShaderFP64Test2 *pGStack_10;
  shaderStage shader_stage_local;
  GPUShaderFP64Test2 *this_local;
  
  gl._4_4_ = shader_stage;
  pGStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _pname = CONCAT44(extraout_var,iVar1);
  local_24 = 0;
  local_28 = 0;
  switch(gl._4_4_) {
  case COMPUTE_SHADER:
    local_28 = 0x8263;
    break;
  case FRAGMENT_SHADER:
    local_28 = 0x8b49;
    break;
  case GEOMETRY_SHADER:
    local_28 = 0x8ddf;
    break;
  case TESS_CTRL_SHADER:
    local_28 = 0x8e7f;
    break;
  case TESS_EVAL_SHADER:
    local_28 = 0x8e80;
    break;
  case VERTEX_SHADER:
    local_28 = 0x8b4a;
  }
  (**(code **)(_pname + 0x868))(local_28,&local_24);
  err = (**(code **)(_pname + 0x800))();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xd8e);
  return local_24;
}

Assistant:

glw::GLuint GPUShaderFP64Test2::getMaxUniformComponents(shaderStage shader_stage) const
{
	const glw::Functions& gl					 = m_context.getRenderContext().getFunctions();
	glw::GLint			  max_uniform_components = 0;
	glw::GLenum			  pname					 = 0;

	switch (shader_stage)
	{
	case COMPUTE_SHADER:
		pname = ARB_MAX_COMPUTE_UNIFORM_COMPONENTS;
		break;
	case FRAGMENT_SHADER:
		pname = GL_MAX_FRAGMENT_UNIFORM_COMPONENTS;
		break;
	case GEOMETRY_SHADER:
		pname = GL_MAX_GEOMETRY_UNIFORM_COMPONENTS;
		break;
	case TESS_CTRL_SHADER:
		pname = GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS;
		break;
	case TESS_EVAL_SHADER:
		pname = GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS;
		break;
	case VERTEX_SHADER:
		pname = GL_MAX_VERTEX_UNIFORM_COMPONENTS;
		break;
	}

	gl.getIntegerv(pname, &max_uniform_components);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	return max_uniform_components;
}